

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall
testing::PrintTestPartResultToString(testing *this,TestPartResult *test_part_result)

{
  size_t sVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int in_ECX;
  size_t extraout_RDX;
  ostream *poVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  char *pcVar6;
  String SVar7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  size_t sVar3;
  
  Message::Message((Message *)&local_48);
  internal::FormatFileLocation_abi_cxx11_
            (&local_40,(internal *)(test_part_result->file_name_).c_str_,
             (char *)(ulong)(uint)test_part_result->line_number_,in_ECX);
  poVar4 = (ostream *)(local_48.ptr_ + 0x10);
  if (local_48.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
  poVar4 = (ostream *)(local_48.ptr_ + 0x10);
  if (local_48.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if ((ulong)test_part_result->type_ < 3) {
    pcVar6 = &DAT_0012a0e0 + *(int *)(&DAT_0012a0e0 + (ulong)test_part_result->type_ * 4);
  }
  else {
    pcVar6 = "Unknown result type";
  }
  poVar4 = (ostream *)(local_48.ptr_ + 0x10);
  if (local_48.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  sVar1 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar1);
  pcVar6 = (test_part_result->message_).c_str_;
  if (pcVar6 == (char *)0x0) {
    sVar5.ptr_ = local_48.ptr_ + 0x10;
    sVar1 = 6;
    pcVar6 = "(null)";
  }
  else {
    sVar5.ptr_ = local_48.ptr_;
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_48.ptr_ + 0x10);
    }
    sVar1 = strlen(pcVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,pcVar6,sVar1);
  SVar7 = internal::StringStreamToString((internal *)this,local_48.ptr_);
  sVar3 = SVar7.length_;
  paVar2 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
    paVar2 = extraout_RAX;
    sVar3 = extraout_RDX;
  }
  SVar7.length_ = sVar3;
  SVar7.c_str_ = (char *)paVar2;
  if (local_48.ptr_ != (stringstream *)0x0) {
    SVar7 = (String)(**(code **)(*(long *)local_48.ptr_ + 8))();
  }
  return SVar7;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}